

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

void xm_volume_slide(xm_channel_context_t *ch,uint8_t rawval)

{
  float f;
  uint8_t rawval_local;
  xm_channel_context_t *ch_local;
  
  if (((rawval & 0xf0) == 0) || ((rawval & 0xf) == 0)) {
    if ((rawval & 0xf0) == 0) {
      ch->volume = ch->volume - (float)(rawval & 0xf) / 64.0;
      if (ch->volume <= 0.0 && ch->volume != 0.0) {
        ch->volume = 0.0;
      }
    }
    else {
      ch->volume = (float)((int)(uint)rawval >> 4) / 64.0 + ch->volume;
      if (1.0 < ch->volume) {
        ch->volume = 1.0;
      }
    }
  }
  return;
}

Assistant:

static void xm_volume_slide(xm_channel_context_t* ch, uint8_t rawval) {
	float f;

	if((rawval & 0xF0) && (rawval & 0x0F)) {
		/* Illegal state */
		return;
	}

	if(rawval & 0xF0) {
		/* Slide up */
		f = (float)(rawval >> 4) / (float)0x40;
		ch->volume += f;
		XM_CLAMP_UP(ch->volume);
	} else {
		/* Slide down */
		f = (float)(rawval & 0x0F) / (float)0x40;
		ch->volume -= f;
		XM_CLAMP_DOWN(ch->volume);
	}
}